

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataView.cpp
# Opt level: O1

bool __thiscall
Rml::DataViews::Update(DataViews *this,DataModel *model,DirtyVariables *dirty_variables)

{
  NameViewMap *this_00;
  int iVar1;
  pointer puVar2;
  unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_> *puVar3;
  pointer pbVar4;
  DataView *pDVar5;
  DataView *pDVar6;
  ObserverPtrBlock *pOVar7;
  long lVar8;
  code *pcVar9;
  iterator iVar10;
  iterator iVar11;
  bool bVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  __normal_iterator<Rml::DataView_**,_std::vector<Rml::DataView_*,_std::allocator<Rml::DataView_*>_>_>
  _Var16;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_true>
  _Var17;
  String *variable_name_1;
  unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_> *__args;
  pointer __k;
  DataView **ppDVar18;
  pointer puVar19;
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_false,_true>
  it;
  DataView **ppDVar20;
  long lVar21;
  String *variable_name;
  _Head_base<0UL,_Rml::DataView_*,_false> _Var22;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_false,_true>_>
  pVar23;
  Vector<DataView_*> dirty_views;
  DirtyVariables *__range2;
  DataView **local_a8;
  iterator iStack_a0;
  DataView **local_98;
  DataViews *local_90;
  long local_88;
  DirtyVariables *local_80;
  undefined8 local_78;
  ulong local_70;
  DataViewList *local_68;
  DataViewList *local_60;
  DataModel *local_58;
  _Head_base<0UL,_Rml::DataView_*,_false> local_50;
  _Head_base<0UL,_Rml::DataView_*,_false> local_48;
  DataView *local_40;
  
  local_60 = &this->views_to_add;
  this_00 = &this->name_view_map;
  local_68 = &this->views_to_remove;
  local_70 = 0;
  local_88 = 0;
  local_78 = 0;
  local_90 = this;
  local_80 = dirty_variables;
  local_58 = model;
  do {
    uVar13 = (uint)local_70;
    if ((uVar13 == 0) ||
       ((this->views_to_add).
        super__Vector_base<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->views_to_add).
        super__Vector_base<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      if (9 < uVar13) goto LAB_00202396;
    }
    else if ((9 < uVar13) ||
            (local_88 ==
             (long)(local_80->m_container).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(local_80->m_container).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5)) {
LAB_00202396:
      return (bool)((byte)local_78 & 1);
    }
    local_88 = (long)(local_80->m_container).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(local_80->m_container).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
    local_a8 = (DataView **)0x0;
    iStack_a0._M_current = (DataView **)0x0;
    local_98 = (DataView **)0x0;
    puVar19 = (this->views_to_add).
              super__Vector_base<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->views_to_add).
             super__Vector_base<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar19 != puVar2) {
      ::std::
      vector<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
      ::reserve(&this->views,
                ((long)puVar2 - (long)puVar19 >> 3) +
                ((long)(this->views).
                       super__Vector_base<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->views).
                       super__Vector_base<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3));
      puVar3 = (this->views_to_add).
               super__Vector_base<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (__args = (this->views_to_add).
                    super__Vector_base<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; __args != puVar3; __args = __args + 1
          ) {
        local_48._M_head_impl =
             (__args->_M_t).super___uniq_ptr_impl<Rml::DataView,_Rml::Releaser<Rml::DataView>_>._M_t
             .super__Tuple_impl<0UL,_Rml::DataView_*,_Rml::Releaser<Rml::DataView>_>.
             super__Head_base<0UL,_Rml::DataView_*,_false>._M_head_impl;
        ::std::vector<Rml::DataView*,std::allocator<Rml::DataView*>>::emplace_back<Rml::DataView*>
                  ((vector<Rml::DataView*,std::allocator<Rml::DataView*>> *)&local_a8,
                   &local_48._M_head_impl);
        (*(((__args->_M_t).super___uniq_ptr_impl<Rml::DataView,_Rml::Releaser<Rml::DataView>_>._M_t.
            super__Tuple_impl<0UL,_Rml::DataView_*,_Rml::Releaser<Rml::DataView>_>.
            super__Head_base<0UL,_Rml::DataView_*,_false>._M_head_impl)->super_Releasable).
          _vptr_Releasable[5])(&local_48);
        pDVar5 = local_40;
        for (_Var22._M_head_impl = local_48._M_head_impl; _Var22._M_head_impl != pDVar5;
            _Var22._M_head_impl = (DataView *)&_Var22._M_head_impl[1].attached_element) {
          local_50._M_head_impl =
               (__args->_M_t).super___uniq_ptr_impl<Rml::DataView,_Rml::Releaser<Rml::DataView>_>.
               _M_t.super__Tuple_impl<0UL,_Rml::DataView_*,_Rml::Releaser<Rml::DataView>_>.
               super__Head_base<0UL,_Rml::DataView_*,_false>._M_head_impl;
          ::std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Rml::DataView*>,std::allocator<std::pair<std::__cxx11::string_const,Rml::DataView*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
          ::_M_emplace<std::__cxx11::string_const&,Rml::DataView*>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Rml::DataView*>,std::allocator<std::pair<std::__cxx11::string_const,Rml::DataView*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                      *)this_00,0,_Var22._M_head_impl,&local_50);
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_48);
        ::std::
        vector<std::unique_ptr<Rml::DataView,Rml::Releaser<Rml::DataView>>,std::allocator<std::unique_ptr<Rml::DataView,Rml::Releaser<Rml::DataView>>>>
        ::emplace_back<std::unique_ptr<Rml::DataView,Rml::Releaser<Rml::DataView>>>
                  ((vector<std::unique_ptr<Rml::DataView,Rml::Releaser<Rml::DataView>>,std::allocator<std::unique_ptr<Rml::DataView,Rml::Releaser<Rml::DataView>>>>
                    *)local_90,__args);
      }
      ::std::
      vector<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
      ::_M_erase_at_end(local_60,(local_60->
                                 super__Vector_base<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
    }
    pbVar4 = (local_80->m_container).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__k = (local_80->m_container).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; this = local_90,
        iVar10._M_current = iStack_a0._M_current, ppDVar18 = local_a8, __k != pbVar4; __k = __k + 1)
    {
      pVar23 = ::std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
               ::equal_range(&this_00->_M_h,__k);
      for (_Var17._M_cur =
                (__node_type *)
                pVar23.first.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_true>
                ._M_cur;
          (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_true>
           )_Var17._M_cur !=
          pVar23.second.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_true>
          ._M_cur.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_true>
          ; _Var17._M_cur = (__node_type *)((_Var17._M_cur)->super__Hash_node_base)._M_nxt) {
        ppDVar18 = (DataView **)
                   ((long)&((_Var17._M_cur)->
                           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_true>
                           ).
                           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>_>
                           ._M_storage._M_storage + 0x20);
        if (iStack_a0._M_current == local_98) {
          ::std::vector<Rml::DataView*,std::allocator<Rml::DataView*>>::
          _M_realloc_insert<Rml::DataView*const&>
                    ((vector<Rml::DataView*,std::allocator<Rml::DataView*>> *)&local_a8,iStack_a0,
                     ppDVar18);
        }
        else {
          *iStack_a0._M_current = *ppDVar18;
          iStack_a0._M_current = iStack_a0._M_current + 1;
        }
      }
    }
    if (local_a8 != iStack_a0._M_current) {
      uVar15 = (long)iStack_a0._M_current - (long)local_a8 >> 3;
      lVar8 = 0x3f;
      if (uVar15 != 0) {
        for (; uVar15 >> lVar8 == 0; lVar8 = lVar8 + -1) {
        }
      }
      ::std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Rml::DataView**,std::vector<Rml::DataView*,std::allocator<Rml::DataView*>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_a8,iStack_a0._M_current,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
      ::std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<Rml::DataView**,std::vector<Rml::DataView*,std::allocator<Rml::DataView*>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (ppDVar18,iVar10._M_current);
    }
    _Var16 = ::std::
             __unique<__gnu_cxx::__normal_iterator<Rml::DataView**,std::vector<Rml::DataView*,std::allocator<Rml::DataView*>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                       (local_a8,iStack_a0._M_current);
    ppDVar18 = local_a8;
    if ((_Var16._M_current != iStack_a0._M_current) && (iStack_a0._M_current != _Var16._M_current))
    {
      iStack_a0._M_current = _Var16._M_current;
    }
    iVar11._M_current = iStack_a0._M_current;
    iVar10._M_current = iStack_a0._M_current;
    if (local_a8 != iStack_a0._M_current) {
      lVar21 = (long)iStack_a0._M_current - (long)local_a8;
      uVar15 = lVar21 >> 3;
      lVar8 = 0x3f;
      if (uVar15 != 0) {
        for (; uVar15 >> lVar8 == 0; lVar8 = lVar8 + -1) {
        }
      }
      ::std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Rml::DataView**,std::vector<Rml::DataView*,std::allocator<Rml::DataView*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Rml::DataViews::Update(Rml::DataModel&,itlib::flat_set<std::__cxx11::string,itlib::fsimpl::less,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>const&)::__0>>
                (local_a8,iStack_a0._M_current,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar21 < 0x81) {
        ::std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Rml::DataView**,std::vector<Rml::DataView*,std::allocator<Rml::DataView*>>>,__gnu_cxx::__ops::_Iter_comp_iter<Rml::DataViews::Update(Rml::DataModel&,itlib::flat_set<std::__cxx11::string,itlib::fsimpl::less,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>const&)::__0>>
                  (ppDVar18,iVar11._M_current);
        ppDVar18 = local_a8;
        iVar10._M_current = iStack_a0._M_current;
        this = local_90;
      }
      else {
        ppDVar20 = ppDVar18 + 0x10;
        ::std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Rml::DataView**,std::vector<Rml::DataView*,std::allocator<Rml::DataView*>>>,__gnu_cxx::__ops::_Iter_comp_iter<Rml::DataViews::Update(Rml::DataModel&,itlib::flat_set<std::__cxx11::string,itlib::fsimpl::less,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>const&)::__0>>
                  (ppDVar18,ppDVar20);
        for (; ppDVar18 = local_a8, iVar10._M_current = iStack_a0._M_current, this = local_90,
            ppDVar20 != iVar11._M_current; ppDVar20 = ppDVar20 + 1) {
          pDVar5 = ppDVar20[-1];
          pDVar6 = *ppDVar20;
          iVar1 = pDVar6->sort_order;
          iVar14 = pDVar5->sort_order;
          ppDVar18 = ppDVar20;
          while (iVar1 < iVar14) {
            *ppDVar18 = pDVar5;
            pDVar5 = ppDVar18[-2];
            ppDVar18 = ppDVar18 + -1;
            iVar14 = pDVar5->sort_order;
          }
          *ppDVar18 = pDVar6;
        }
      }
    }
    for (; ppDVar18 != iVar10._M_current; ppDVar18 = ppDVar18 + 1) {
      pDVar5 = *ppDVar18;
      if (pDVar5 == (DataView *)0x0) {
        bVar12 = Assert("RMLUI_ASSERT(view)",
                        "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataView.cpp"
                        ,0x88);
        if (!bVar12) {
          pcVar9 = (code *)invalidInstructionException();
          (*pcVar9)();
        }
      }
      else {
        pOVar7 = (pDVar5->attached_element).block;
        if ((pOVar7 != (ObserverPtrBlock *)0x0) && (pOVar7->pointed_to_object != (void *)0x0)) {
          iVar14 = (*(pDVar5->super_Releasable)._vptr_Releasable[4])(pDVar5,local_58);
          local_78 = CONCAT71((int7)((ulong)local_78 >> 8),(byte)local_78 | (byte)iVar14);
        }
      }
    }
    puVar19 = (this->views_to_remove).
              super__Vector_base<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->views_to_remove).
             super__Vector_base<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar19 != puVar2) {
      do {
        _Var17._M_cur = (__node_type *)(this->name_view_map)._M_h._M_before_begin._M_nxt;
        while (_Var17._M_cur != (__node_type *)0x0) {
          if (*(DataView **)((long)_Var17._M_cur + 0x28) ==
              (puVar19->_M_t).super___uniq_ptr_impl<Rml::DataView,_Rml::Releaser<Rml::DataView>_>.
              _M_t.super__Tuple_impl<0UL,_Rml::DataView_*,_Rml::Releaser<Rml::DataView>_>.
              super__Head_base<0UL,_Rml::DataView_*,_false>._M_head_impl) {
            _Var17._M_cur =
                 (__node_type *)
                 ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataView_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                 ::erase(&this_00->_M_h,_Var17._M_cur);
          }
          else {
            _Var17._M_cur = *_Var17._M_cur;
          }
        }
        puVar19 = puVar19 + 1;
      } while (puVar19 != puVar2);
      ::std::
      vector<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
      ::_M_erase_at_end(local_68,(local_68->
                                 super__Vector_base<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>,_std::allocator<std::unique_ptr<Rml::DataView,_Rml::Releaser<Rml::DataView>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_a8 != (DataView **)0x0) {
      operator_delete(local_a8,(long)local_98 - (long)local_a8);
    }
    local_88 = local_88 >> 5;
    local_70 = (ulong)((int)local_70 + 1);
  } while( true );
}

Assistant:

bool DataViews::Update(DataModel& model, const DirtyVariables& dirty_variables)
{
	bool result = false;
	size_t num_dirty_variables_prev = 0;

	// View updates may result in newly added views, or even new dirty variables. Thus, we do the
	// update recursively but with an upper limit. Without the loop, newly added views won't be
	// updated until the next Update() call.
	for (int i = 0; (i == 0 || !views_to_add.empty() || num_dirty_variables_prev != dirty_variables.size()) && i < 10; i++)
	{
		num_dirty_variables_prev = dirty_variables.size();

		Vector<DataView*> dirty_views;

		if (!views_to_add.empty())
		{
			views.reserve(views.size() + views_to_add.size());
			for (auto&& view : views_to_add)
			{
				dirty_views.push_back(view.get());
				for (const String& variable_name : view->GetVariableNameList())
					name_view_map.emplace(variable_name, view.get());

				views.push_back(std::move(view));
			}
			views_to_add.clear();
		}

		for (const String& variable_name : dirty_variables)
		{
			auto pair = name_view_map.equal_range(variable_name);
			for (auto it = pair.first; it != pair.second; ++it)
				dirty_views.push_back(it->second);
		}

		// Remove duplicate entries
		std::sort(dirty_views.begin(), dirty_views.end());
		auto it_remove = std::unique(dirty_views.begin(), dirty_views.end());
		dirty_views.erase(it_remove, dirty_views.end());

		// Sort by the element's depth in the document tree so that any structural changes due to a changed variable are reflected in the element's
		// children. Eg. the 'data-for' view will remove children if any of its data variable array size is reduced.
		std::sort(dirty_views.begin(), dirty_views.end(), [](auto&& left, auto&& right) { return left->GetSortOrder() < right->GetSortOrder(); });

		for (DataView* view : dirty_views)
		{
			RMLUI_ASSERT(view);
			if (!view)
				continue;

			if (view->IsValid())
				result |= view->Update(model);
		}

		// Destroy views marked for destruction
		// @performance: Horrible...
		if (!views_to_remove.empty())
		{
			for (const auto& view : views_to_remove)
			{
				for (auto it = name_view_map.begin(); it != name_view_map.end();)
				{
					if (it->second == view.get())
						it = name_view_map.erase(it);
					else
						++it;
				}
			}

			views_to_remove.clear();
		}
	}

	return result;
}